

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O2

DWORD * __thiscall
HMISong::MakeEvents(HMISong *this,DWORD *events,DWORD *max_event_p,DWORD max_time)

{
  TrackInfo *track;
  DWORD delay;
  DWORD time;
  DWORD *events_00;
  bool sysex_noroom;
  bool local_41;
  uint local_40;
  uint local_3c;
  DWORD *local_38;
  
  track = this->TrackDue;
  local_40 = 0;
  local_3c = max_time;
  local_38 = events;
LAB_003599e8:
  do {
    if (((max_event_p <= events) || (track == (TrackInfo *)0x0)) || (local_3c < local_40)) {
      return events;
    }
    time = track->Delay;
    delay = 0;
    do {
      delay = delay + time;
      local_40 = ((this->super_MIDIStreamer).Tempo * time) /
                 (uint)(this->super_MIDIStreamer).Division + local_40;
      AdvanceTracks(this,time);
      track = this->TrackDue;
      events_00 = events;
      do {
        local_41 = false;
        events = SendCommand(this,events_00,track,delay,(long)max_event_p - (long)events_00 >> 2,
                             &local_41);
        if (local_41 == true) {
          return events_00;
        }
        track = FindNextDue(this);
        this->TrackDue = track;
        if (track == (TrackInfo *)0x0) goto LAB_003599e8;
        if (events != events_00) {
          delay = 0;
        }
        time = track->Delay;
      } while ((events < max_event_p) && (events_00 = events, time == 0));
    } while (events == local_38);
  } while( true );
}

Assistant:

DWORD *HMISong::MakeEvents(DWORD *events, DWORD *max_event_p, DWORD max_time)
{
	DWORD *start_events;
	DWORD tot_time = 0;
	DWORD time = 0;
	DWORD delay;

	start_events = events;
	while (TrackDue && events < max_event_p && tot_time <= max_time)
	{
		// It's possible that this tick may be nothing but meta-events and
		// not generate any real events. Repeat this until we actually
		// get some output so we don't send an empty buffer to the MIDI
		// device.
		do
		{
			delay = TrackDue->Delay;
			time += delay;
			// Advance time for all tracks by the amount needed for the one up next.
			tot_time += delay * Tempo / Division;
			AdvanceTracks(delay);
			// Play all events for this tick.
			do
			{
				bool sysex_noroom = false;
				DWORD *new_events = SendCommand(events, TrackDue, time, max_event_p - events, sysex_noroom);
				if (sysex_noroom)
				{
					return events;
				}
				TrackDue = FindNextDue();
				if (new_events != events)
				{
					time = 0;
				}
				events = new_events;
			}
			while (TrackDue && TrackDue->Delay == 0 && events < max_event_p);
		}
		while (start_events == events && TrackDue);
		time = 0;
	}
	return events;
}